

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<kj::_::Delimited<kj::ArrayPtr<int>_>_>::~Array
          (Array<kj::_::Delimited<kj::ArrayPtr<int>_>_> *this)

{
  Delimited<kj::ArrayPtr<int>_> *pDVar1;
  size_t sVar2;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (Delimited<kj::ArrayPtr<int>_> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Delimited<kj::ArrayPtr<int>_> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pDVar1,0x38,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::Delimited<kj::ArrayPtr<int>_>_>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }